

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared-c.cpp
# Opt level: O2

duckdb_state
duckdb_prepare(duckdb_connection connection,char *query,
              duckdb_prepared_statement *out_prepared_statement)

{
  undefined8 __p;
  bool bVar1;
  duckdb_state dVar2;
  duckdb_prepared_statement p_Var3;
  pointer this;
  allocator local_51;
  undefined1 local_50 [40];
  
  if (out_prepared_statement == (duckdb_prepared_statement *)0x0 ||
      (query == (char *)0x0 || connection == (duckdb_connection)0x0)) {
    dVar2 = DuckDBError;
  }
  else {
    p_Var3 = (duckdb_prepared_statement)operator_new(0x40);
    *(long *)(p_Var3 + 0x20) = 0;
    *(long *)(p_Var3 + 0x28) = 0;
    *(duckdb_prepared_statement *)p_Var3 = p_Var3 + 0x30;
    *(long *)(p_Var3 + 8) = 1;
    *(long *)(p_Var3 + 0x10) = 0;
    *(long *)(p_Var3 + 0x18) = 0;
    *(undefined4 *)(p_Var3 + 0x20) = 0x3f800000;
    *(long *)(p_Var3 + 0x28) = 0;
    *(long *)(p_Var3 + 0x30) = 0;
    *(long *)(p_Var3 + 0x38) = 0;
    std::__cxx11::string::string((string *)(local_50 + 8),query,&local_51);
    duckdb::Connection::Prepare((Connection *)local_50,(string *)connection);
    __p = local_50._0_8_;
    local_50._0_8_ =
         (__uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
          )0x0;
    std::__uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
    ::reset((__uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
             *)(p_Var3 + 0x38),(pointer)__p);
    std::unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>::
    ~unique_ptr((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
                 *)local_50);
    std::__cxx11::string::~string((string *)(local_50 + 8));
    *out_prepared_statement = p_Var3;
    this = duckdb::
           unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
           ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                         *)(p_Var3 + 0x38));
    bVar1 = duckdb::PreparedStatement::HasError(this);
    dVar2 = (duckdb_state)bVar1;
  }
  return dVar2;
}

Assistant:

duckdb_state duckdb_prepare(duckdb_connection connection, const char *query,
                            duckdb_prepared_statement *out_prepared_statement) {
	if (!connection || !query || !out_prepared_statement) {
		return DuckDBError;
	}
	auto wrapper = new PreparedStatementWrapper();
	Connection *conn = reinterpret_cast<Connection *>(connection);
	wrapper->statement = conn->Prepare(query);
	*out_prepared_statement = reinterpret_cast<duckdb_prepared_statement>(wrapper);
	return !wrapper->statement->HasError() ? DuckDBSuccess : DuckDBError;
}